

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

Scalar * __thiscall
Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]
          (Matrix_Sparse_Row<Disa::Matrix_Sparse> *this,size_t *i_column)

{
  size_t *i_row;
  bool bVar1;
  ostream *poVar2;
  source_location *in_RCX;
  string sStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  iterator_element local_40;
  
  i_row = &this->row_index;
  bVar1 = Matrix_Sparse::contains(this->matrix,i_row,i_column);
  if (bVar1) {
    Matrix_Sparse::find(&local_40,this->matrix,i_row,i_column);
    return local_40.value;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_0017bc90;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
             (Disa *)0x0,(Log_Level)&local_48,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  Matrix_Sparse::row_column_abi_cxx11_(&sStack_a8,(Matrix_Sparse *)*i_row,*i_column,(size_t)in_RCX);
  std::operator+(&local_88,"Trying to access a zero element at [",&sStack_a8);
  std::operator+(&local_68,&local_88,"].");
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

constexpr const Scalar& operator[](const std::size_t& i_column) const {
    ASSERT_DEBUG(matrix->contains(row_index, i_column),
                 "Trying to access a zero element at [" + matrix->row_column(row_index, i_column) + "].");
    return *matrix->find(row_index, i_column);
  }